

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall leveldb::VersionSet::WriteSnapshot(VersionSet *this,Writer *log)

{
  value_type pFVar1;
  int iVar2;
  Comparator *pCVar3;
  undefined4 extraout_var;
  ulong uVar4;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  FileMetaData *pFVar5;
  const_reference ppFVar6;
  pointer in_RDX;
  Slice local_168;
  string local_158 [8];
  string record;
  FileMetaData *f;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  undefined1 local_118 [4];
  int level_1;
  undefined1 local_108 [8];
  InternalKey key;
  int level;
  Slice local_d8;
  undefined1 local_c8 [8];
  VersionEdit edit;
  Writer *log_local;
  VersionSet *this_local;
  
  edit.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  VersionEdit::VersionEdit((VersionEdit *)local_c8);
  pCVar3 = InternalKeyComparator::user_comparator((InternalKeyComparator *)(log[1].type_crc_ + 3));
  iVar2 = (*pCVar3->_vptr_Comparator[3])();
  Slice::Slice(&local_d8,(char *)CONCAT44(extraout_var,iVar2));
  VersionEdit::SetComparatorName((VersionEdit *)local_c8,&local_d8);
  for (key._24_4_ = 0; (int)key._24_4_ < 7; key._24_4_ = key._24_4_ + 1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      InternalKey::InternalKey((InternalKey *)local_108);
      Slice::Slice((Slice *)local_118,(string *)(log[(long)(int)key._24_4_ + 0xb].type_crc_ + 1));
      InternalKey::DecodeFrom((InternalKey *)local_108,(Slice *)local_118);
      VersionEdit::SetCompactPointer((VersionEdit *)local_c8,key._24_4_,(InternalKey *)local_108);
      InternalKey::~InternalKey((InternalKey *)local_108);
    }
  }
  for (files._4_4_ = 0; files._4_4_ < 7; files._4_4_ = files._4_4_ + 1) {
    this_00 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
              (*(long *)&log[0xb].block_offset_ + 0x20 + (long)files._4_4_ * 0x18);
    f = (FileMetaData *)0x0;
    while( true ) {
      pFVar5 = (FileMetaData *)
               std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                         (this_00);
      if (pFVar5 <= f) break;
      ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this_00,(size_type)f);
      pFVar1 = *ppFVar6;
      VersionEdit::AddFile
                ((VersionEdit *)local_c8,files._4_4_,pFVar1->number,pFVar1->file_size,
                 &pFVar1->smallest,&pFVar1->largest);
      f = (FileMetaData *)((long)&f->refs + 1);
    }
  }
  std::__cxx11::string::string(local_158);
  VersionEdit::EncodeTo((VersionEdit *)local_c8,(string *)local_158);
  Slice::Slice(&local_168,(string *)local_158);
  leveldb::log::Writer::AddRecord
            ((Writer *)this,
             (Slice *)edit.new_files_.
                      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_158);
  VersionEdit::~VersionEdit((VersionEdit *)local_c8);
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::WriteSnapshot(log::Writer* log) {
  // TODO: Break up into multiple records to reduce memory usage on recovery?

  // Save metadata
  VersionEdit edit;
  edit.SetComparatorName(icmp_.user_comparator()->Name());

  // Save compaction pointers
  for (int level = 0; level < config::kNumLevels; level++) {
    if (!compact_pointer_[level].empty()) {
      InternalKey key;
      key.DecodeFrom(compact_pointer_[level]);
      edit.SetCompactPointer(level, key);
    }
  }

  // Save files
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = current_->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      edit.AddFile(level, f->number, f->file_size, f->smallest, f->largest);
    }
  }

  std::string record;
  edit.EncodeTo(&record);
  return log->AddRecord(record);
}